

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

void __thiscall cmDocumentation::addCommonStandardDocSections(cmDocumentation *this)

{
  cmDocumentationSection sec;
  cmDocumentationSection cStack_48;
  
  cmDocumentationSection::cmDocumentationSection(&cStack_48,"Options");
  cmDocumentationSection::Append(&cStack_48,cmDocumentationStandardOptions);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmDocumentationSection>,std::_Select1st<std::pair<std::__cxx11::string_const,cmDocumentationSection>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDocumentationSection>>>
  ::_M_emplace_unique<char_const(&)[8],cmDocumentationSection>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmDocumentationSection>,std::_Select1st<std::pair<std::__cxx11::string_const,cmDocumentationSection>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDocumentationSection>>>
              *)&this->AllSections,(char (*) [8])"Options",&cStack_48);
  cmDocumentationSection::~cmDocumentationSection(&cStack_48);
  return;
}

Assistant:

void cmDocumentation::addCommonStandardDocSections()
{
  cmDocumentationSection sec{ "Options" };
  sec.Append(cmDocumentationStandardOptions);
  this->AllSections.emplace("Options", std::move(sec));
}